

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void groupConcatValue(sqlite3_context *context)

{
  char *pcVar1;
  
  if ((context->pMem->flags & 0x2000) == 0) {
    pcVar1 = (char *)createAggContext(context,0);
  }
  else {
    pcVar1 = context->pMem->z;
  }
  if (pcVar1 == (char *)0x0) {
    return;
  }
  if (pcVar1[0x1c] == '\a') {
    sqlite3_result_error_nomem(context);
    return;
  }
  if (pcVar1[0x1c] == '\x12') {
    context->isError = 0x12;
    sqlite3VdbeMemSetStr
              (context->pOut,"string or blob too big",-1,'\x01',(_func_void_void_ptr *)0x0);
    return;
  }
  if ((ulong)*(uint *)(pcVar1 + 0x18) == 0) {
    pcVar1 = (char *)0x0;
  }
  else {
    *(undefined1 *)(*(long *)(pcVar1 + 8) + (ulong)*(uint *)(pcVar1 + 0x18)) = 0;
    pcVar1 = *(char **)(pcVar1 + 8);
  }
  setResultStrOrError(context,pcVar1,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  return;
}

Assistant:

static void groupConcatValue(sqlite3_context *context){
  sqlite3_str *pAccum;
  pAccum = (sqlite3_str*)sqlite3_aggregate_context(context, 0);
  if( pAccum ){
    if( pAccum->accError==SQLITE_TOOBIG ){
      sqlite3_result_error_toobig(context);
    }else if( pAccum->accError==SQLITE_NOMEM ){
      sqlite3_result_error_nomem(context);
    }else{    
      const char *zText = sqlite3_str_value(pAccum);
      sqlite3_result_text(context, zText, -1, SQLITE_TRANSIENT);
    }
  }
}